

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3SelectDoctotal(Fts3Table *pTab,sqlite3_stmt **ppStmt)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  Mem *pMVar4;
  sqlite3_stmt *pStmt;
  sqlite3_stmt *local_28;
  
  local_28 = (sqlite3_stmt *)0x0;
  iVar2 = fts3SqlStmt(pTab,0x16,&local_28,(sqlite3_value **)0x0);
  pStmt = local_28;
  if (iVar2 == 0) {
    iVar2 = 0;
    sqlite3_bind_int64(local_28,1,0);
    iVar3 = sqlite3_step(pStmt);
    if (iVar3 == 100) {
      pMVar4 = columnMem(pStmt,0);
      uVar1 = pMVar4->flags;
      columnMallocFailure(pStmt);
      if ((uVar1 & 0xf) == 0) goto LAB_001be6f0;
    }
    iVar3 = sqlite3_reset(pStmt);
    iVar2 = 0x10b;
    if (iVar3 != 0) {
      iVar2 = iVar3;
    }
    pStmt = (sqlite3_stmt *)0x0;
  }
LAB_001be6f0:
  *ppStmt = pStmt;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SelectDoctotal(
  Fts3Table *pTab,                /* Fts3 table handle */
  sqlite3_stmt **ppStmt           /* OUT: Statement handle */
){
  sqlite3_stmt *pStmt = 0;
  int rc;
  rc = fts3SqlStmt(pTab, SQL_SELECT_STAT, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
    if( sqlite3_step(pStmt)!=SQLITE_ROW
     || sqlite3_column_type(pStmt, 0)!=SQLITE_BLOB
    ){
      rc = sqlite3_reset(pStmt);
      if( rc==SQLITE_OK ) rc = FTS_CORRUPT_VTAB;
      pStmt = 0;
    }
  }
  *ppStmt = pStmt;
  return rc;
}